

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O3

hash_entry_t * hash_detach_entry(adh_node_t *node)

{
  hash_entry_t *phVar1;
  hash_entry_t *phVar2;
  uint uVar3;
  hash_entry **pphVar4;
  
  uVar3 = node->weight % 0x1eef;
  phVar2 = map_weight_nodes.buckets[uVar3];
  if (phVar2 != (hash_entry_t *)0x0) {
    do {
      if (phVar2->value == node) {
        phVar1 = phVar2->next;
        pphVar4 = &phVar2->prev->next;
        if (phVar2->prev == (hash_entry *)0x0) {
          pphVar4 = map_weight_nodes.buckets + uVar3;
        }
        *pphVar4 = phVar1;
        if (phVar1 != (hash_entry_t *)0x0) {
          phVar1->prev = phVar2->prev;
        }
        phVar2->next = (hash_entry *)0x0;
        phVar2->prev = (hash_entry *)0x0;
        return phVar2;
      }
      phVar2 = phVar2->next;
    } while (phVar2 != (hash_entry *)0x0);
  }
  return (hash_entry_t *)0x0;
}

Assistant:

hash_entry_t* hash_detach_entry(adh_node_t *node) {
    int hash_index = hash_get_index(node->weight);

    hash_entry_t  *entry = map_weight_nodes.buckets[hash_index];
    while(entry) {
        if(entry->value == node) {
            if(entry->prev == NULL) {
                map_weight_nodes.buckets[hash_index] = entry->next;
            }
            else {
                entry->prev->next = entry->next;
            }

            if(entry->next)
                entry->next->prev = entry->prev;

            entry->prev = NULL;
            entry->next = NULL;
            return entry;
        }
        entry = entry->next;
    }
    return NULL;
}